

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O3

unsigned_short __thiscall UniValue::getInt<unsigned_short>(UniValue *this)

{
  char *__first;
  runtime_error *this_00;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_short> _Var1;
  unsigned_short result;
  unsigned_short local_1e;
  VType local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = VNUM;
  checkType(this,&local_1c);
  __first = (this->val)._M_dataplus._M_p;
  _Var1 = std::from_chars<unsigned_short>
                    (__first,__first + (this->val)._M_string_length,&local_1e,10);
  if ((_Var1.ptr == (this->val)._M_dataplus._M_p + (this->val)._M_string_length) && (_Var1.ec == 0))
  {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return local_1e;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON integer out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

Int UniValue::getInt() const
{
    static_assert(std::is_integral<Int>::value);
    checkType(VNUM);
    Int result;
    const auto [first_nonmatching, error_condition] = std::from_chars(val.data(), val.data() + val.size(), result);
    if (first_nonmatching != val.data() + val.size() || error_condition != std::errc{}) {
        throw std::runtime_error("JSON integer out of range");
    }
    return result;
}